

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::rehash
          (Data<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  ulong uVar6;
  Node<QGesture_*,_QPointer<QWidget>_> *pNVar7;
  ulong uVar8;
  Span *pSVar9;
  size_t index;
  long lVar10;
  size_t numBuckets;
  long lVar11;
  long in_FS_OFFSET;
  R RVar12;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar10 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar12 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar12.spans;
  this->numBuckets = numBuckets;
  pSVar9 = pSVar3;
  for (uVar8 = 0; uVar8 != uVar2 >> 7; uVar8 = uVar8 + 1) {
    for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 1) {
      uVar6 = (ulong)pSVar9->offsets[lVar10];
      if (uVar6 != 0xff) {
        pEVar4 = pSVar3[uVar8].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>>::findBucket<QGesture*>
                             ((Data<QHashPrivate::Node<QGesture*,QPointer<QWidget>>> *)this,
                              (QGesture **)(pEVar4 + uVar6));
        pNVar7 = Bucket::insert(&local_48);
        pDVar5 = *(Data **)(pEVar4[uVar6].storage.data + 8);
        pNVar7->key = *(QGesture **)pEVar4[uVar6].storage.data;
        (pNVar7->value).wp.d = pDVar5;
        (pNVar7->value).wp.value = *(QObject **)(pEVar4[uVar6].storage.data + 0x10);
        puVar1 = pEVar4[uVar6].storage.data + 8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
      }
    }
    Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::freeData(pSVar3 + uVar8);
    pSVar9 = pSVar9 + 1;
  }
  if (pSVar3 != (Span *)0x0) {
    lVar10 = *(long *)&pSVar3[-1].allocated;
    if (lVar10 != 0) {
      lVar11 = lVar10 * 0x90;
      do {
        Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::freeData
                  ((Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *)
                   (pSVar3[-1].offsets + lVar11));
        lVar11 = lVar11 + -0x90;
      } while (lVar11 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar10 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }